

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::InstanceSymbol::resolvePortConnections(InstanceSymbol *this)

{
  char *pcVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  *this_00;
  undefined1 auVar4 [16];
  long lVar5;
  bool bVar6;
  int iVar7;
  InstanceSymbol *instance;
  unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *puVar8;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  uint uVar9;
  Compilation *pCVar10;
  ulong hash;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> *in_R9;
  EVP_PKEY_CTX *pEVar11;
  ulong uVar12;
  SyntaxNode **ppSVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> sVar19;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> conns;
  try_emplace_args_t local_c1;
  PortConnection *local_c0;
  ulong local_b8;
  Compilation *local_b0;
  SyntaxNode **local_a8;
  ulong local_a0;
  char local_98;
  char cStack_97;
  char cStack_96;
  byte bStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  byte bStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  byte bStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  byte bStack_89;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> local_88;
  locator local_48;
  EVP_PKEY_CTX *extraout_RDX;
  
  sVar19 = InstanceBodySymbol::getPortList(this->body);
  ports._M_ptr = sVar19._M_extent._M_extent_value;
  instance = (InstanceSymbol *)sVar19._M_ptr;
  if (this->connectionMap == (PointerMap *)0x0) {
    pCVar10 = ((this->super_InstanceSymbolBase).super_Symbol.parentScope)->compilation;
    puVar8 = TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
             ::emplace<>(&pCVar10->pointerMapAllocator);
    this->connectionMap = puVar8;
    pSVar3 = (this->super_InstanceSymbolBase).super_Symbol.originatingSyntax;
    if ((pSVar3 == (SyntaxNode *)0x0) || (pSVar3->kind != HierarchicalInstance)) {
      bVar6 = isTopLevel(this);
      if ((bVar6) && (((pCVar10->options).flags.m_bits & 0x10) != 0)) {
        connectDefaultIfacePorts(this);
        return;
      }
    }
    else {
      local_88.super_SyntaxListBase._vptr_SyntaxListBase =
           (_func_int **)&local_88.super_SyntaxListBase.super_SyntaxNode.previewNode;
      local_88.super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
      local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x5;
      ports._M_extent._M_extent_value = (size_t)(pSVar3 + 2);
      local_b0 = pCVar10;
      PortConnection::makeConnections((PortConnection *)this,instance,ports,&local_88,in_R9);
      local_a8 = (SyntaxNode **)
                 (local_88.super_SyntaxListBase._vptr_SyntaxListBase +
                 local_88.super_SyntaxListBase.super_SyntaxNode._0_8_);
      src = extraout_RDX;
      for (ppSVar13 = (SyntaxNode **)local_88.super_SyntaxListBase._vptr_SyntaxListBase;
          ppSVar13 != local_a8; ppSVar13 = ppSVar13 + 1) {
        local_c0 = (PortConnection *)*ppSVar13;
        this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                   *)this->connectionMap;
        local_b8 = *(ulong *)&(instance->super_InstanceSymbolBase).super_Symbol;
        instance = (InstanceSymbol *)&(instance->super_InstanceSymbolBase).super_Symbol.name;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_b8;
        hash = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
        src = (EVP_PKEY_CTX *)(hash >> ((byte)*this_00 & 0x3f));
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar12 = 0;
        pEVar11 = src;
        do {
          pcVar1 = (char *)(*(long *)(this_00 + 0x10) + (long)pEVar11 * 0x10);
          local_98 = *pcVar1;
          cStack_97 = pcVar1[1];
          cStack_96 = pcVar1[2];
          bStack_95 = pcVar1[3];
          cStack_94 = pcVar1[4];
          cStack_93 = pcVar1[5];
          cStack_92 = pcVar1[6];
          bStack_91 = pcVar1[7];
          cStack_90 = pcVar1[8];
          cStack_8f = pcVar1[9];
          cStack_8e = pcVar1[10];
          bStack_8d = pcVar1[0xb];
          cStack_8c = pcVar1[0xc];
          cStack_8b = pcVar1[0xd];
          cStack_8a = pcVar1[0xe];
          bStack_89 = pcVar1[0xf];
          cVar14 = (char)uVar2;
          auVar18[0] = -(local_98 == cVar14);
          cVar15 = (char)((uint)uVar2 >> 8);
          auVar18[1] = -(cStack_97 == cVar15);
          cVar16 = (char)((uint)uVar2 >> 0x10);
          auVar18[2] = -(cStack_96 == cVar16);
          bVar17 = (byte)((uint)uVar2 >> 0x18);
          auVar18[3] = -(bStack_95 == bVar17);
          auVar18[4] = -(cStack_94 == cVar14);
          auVar18[5] = -(cStack_93 == cVar15);
          auVar18[6] = -(cStack_92 == cVar16);
          auVar18[7] = -(bStack_91 == bVar17);
          auVar18[8] = -(cStack_90 == cVar14);
          auVar18[9] = -(cStack_8f == cVar15);
          auVar18[10] = -(cStack_8e == cVar16);
          auVar18[0xb] = -(bStack_8d == bVar17);
          auVar18[0xc] = -(cStack_8c == cVar14);
          auVar18[0xd] = -(cStack_8b == cVar15);
          auVar18[0xe] = -(cStack_8a == cVar16);
          auVar18[0xf] = -(bStack_89 == bVar17);
          uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
          if (uVar9 != 0) {
            do {
              iVar7 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              local_a0 = local_b8;
              if (*(ulong *)((long)pEVar11 * 0xf0 + *(long *)(this_00 + 0x18) +
                            (ulong)(uint)(iVar7 << 4)) == local_b8) goto LAB_00214b88;
              uVar9 = uVar9 - 1 & uVar9;
            } while (uVar9 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_89) == 0) break;
          lVar5 = uVar12 + 1;
          uVar12 = uVar12 + 1;
          pEVar11 = (EVP_PKEY_CTX *)((ulong)(pEVar11 + lVar5) & *(ulong *)(this_00 + 8));
        } while (uVar12 <= *(ulong *)(this_00 + 8));
        if (*(ulong *)(this_00 + 0x28) < *(ulong *)(this_00 + 0x20)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    (&local_48,this_00,(size_t)src,hash,&local_c1,&local_b8,
                     (unsigned_long *)&local_c0);
          src = extraout_RDX_00;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    (&local_48,this_00,hash,&local_c1,&local_b8,(unsigned_long *)&local_c0);
          src = extraout_RDX_01;
        }
LAB_00214b88:
      }
      pCVar10 = local_b0;
      iVar7 = SmallVectorBase<const_slang::ast::PortConnection_*>::copy
                        ((SmallVectorBase<const_slang::ast::PortConnection_*> *)&local_88,
                         (EVP_PKEY_CTX *)local_b0,src);
      (this->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar7);
      (this->connections)._M_extent._M_extent_value = extraout_RDX_02;
      SmallVectorBase<const_slang::ast::PortConnection_*>::cleanup
                ((SmallVectorBase<const_slang::ast::PortConnection_*> *)&local_88,
                 (EVP_PKEY_CTX *)pCVar10);
    }
  }
  return;
}

Assistant:

void InstanceSymbol::resolvePortConnections() const {
    // Note: the order of operations here is very subtly important.
    // In order to resolve connections, we need to actually know our list of ports.
    // Asking the body for the list of ports requires fully elaborating the instance,
    // especially because of things like non-ansi port declarations which might be
    // deep in the body. That process of elaboration can actually depend back on the
    // port connections because of interface ports.
    // For example:
    //
    //     interface I #(parameter int i) (); endinterface
    //     module M(I iface, input logic [iface.i - 1 : 0] foo);
    //         localparam int j = $bits(foo);
    //     endmodule
    //
    // In order to resolve connections for an instance of M, we elaborate its body,
    // which then requires evaluating $bits(foo) which then depends on the connection
    // provided to `iface`. In the code, this translates to a reetrant call to this
    // function; the first time we call getPortList() on the body will call back in here.
    auto portList = body.getPortList();
    if (connectionMap)
        return;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    connectionMap = comp.allocPointerMap();

    auto syntax = getSyntax();
    if (!syntax || syntax->kind != SyntaxKind::HierarchicalInstance) {
        // If this is a top level module and we have interface ports, the user has
        // the option of allowing it by automatically instantiating interface instances
        // to connect them to.
        if (isTopLevel() && comp.hasFlag(CompilationFlags::AllowTopLevelIfacePorts))
            connectDefaultIfacePorts();
        return;
    }

    SmallVector<const PortConnection*> conns;
    PortConnection::makeConnections(*this, portList,
                                    syntax->as<HierarchicalInstanceSyntax>().connections, conns);

    auto portIt = portList.begin();
    for (auto conn : conns) {
        SLANG_ASSERT(portIt != portList.end());
        connectionMap->emplace(reinterpret_cast<uintptr_t>(*portIt++),
                               reinterpret_cast<uintptr_t>(conn));
    }

    SLANG_ASSERT(portIt == portList.end());
    connections = conns.copy(comp);
}